

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

xmlElementPtr xmlValidGetElemDecl(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem,int *extsubset)

{
  xmlChar *local_40;
  xmlChar *prefix;
  xmlElementPtr elemDecl;
  int *extsubset_local;
  xmlNodePtr elem_local;
  xmlDocPtr doc_local;
  xmlValidCtxtPtr ctxt_local;
  
  prefix = (xmlChar *)0x0;
  local_40 = (xmlChar *)0x0;
  if ((((ctxt == (xmlValidCtxtPtr)0x0) || (doc == (xmlDocPtr)0x0)) || (elem == (xmlNodePtr)0x0)) ||
     (elem->name == (xmlChar *)0x0)) {
    ctxt_local = (xmlValidCtxtPtr)0x0;
  }
  else {
    if (extsubset != (int *)0x0) {
      *extsubset = 0;
    }
    if ((elem->ns != (xmlNs *)0x0) && (elem->ns->prefix != (xmlChar *)0x0)) {
      local_40 = elem->ns->prefix;
    }
    if (((local_40 != (xmlChar *)0x0) &&
        (prefix = (xmlChar *)xmlGetDtdQElementDesc(doc->intSubset,elem->name,local_40),
        (xmlElementPtr)prefix == (xmlElementPtr)0x0)) &&
       ((doc->extSubset != (_xmlDtd *)0x0 &&
        ((prefix = (xmlChar *)xmlGetDtdQElementDesc(doc->extSubset,elem->name,local_40),
         (xmlElementPtr)prefix != (xmlElementPtr)0x0 && (extsubset != (int *)0x0)))))) {
      *extsubset = 1;
    }
    if ((((prefix == (xmlChar *)0x0) &&
         (prefix = (xmlChar *)xmlGetDtdQElementDesc(doc->intSubset,elem->name,(xmlChar *)0x0),
         (xmlElementPtr)prefix == (xmlElementPtr)0x0)) && (doc->extSubset != (_xmlDtd *)0x0)) &&
       ((prefix = (xmlChar *)xmlGetDtdQElementDesc(doc->extSubset,elem->name,(xmlChar *)0x0),
        (xmlElementPtr)prefix != (xmlElementPtr)0x0 && (extsubset != (int *)0x0)))) {
      *extsubset = 1;
    }
    ctxt_local = (xmlValidCtxtPtr)prefix;
  }
  return (xmlElementPtr)ctxt_local;
}

Assistant:

static xmlElementPtr
xmlValidGetElemDecl(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
	            xmlNodePtr elem, int *extsubset) {
    xmlElementPtr elemDecl = NULL;
    const xmlChar *prefix = NULL;

    if ((ctxt == NULL) || (doc == NULL) ||
        (elem == NULL) || (elem->name == NULL))
        return(NULL);
    if (extsubset != NULL)
	*extsubset = 0;

    /*
     * Fetch the declaration for the qualified name
     */
    if ((elem->ns != NULL) && (elem->ns->prefix != NULL))
	prefix = elem->ns->prefix;

    if (prefix != NULL) {
	elemDecl = xmlGetDtdQElementDesc(doc->intSubset,
		                         elem->name, prefix);
	if ((elemDecl == NULL) && (doc->extSubset != NULL)) {
	    elemDecl = xmlGetDtdQElementDesc(doc->extSubset,
		                             elem->name, prefix);
	    if ((elemDecl != NULL) && (extsubset != NULL))
		*extsubset = 1;
	}
    }

    /*
     * Fetch the declaration for the non qualified name
     * This is "non-strict" validation should be done on the
     * full QName but in that case being flexible makes sense.
     */
    if (elemDecl == NULL) {
	elemDecl = xmlGetDtdQElementDesc(doc->intSubset, elem->name, NULL);
	if ((elemDecl == NULL) && (doc->extSubset != NULL)) {
	    elemDecl = xmlGetDtdQElementDesc(doc->extSubset, elem->name, NULL);
	    if ((elemDecl != NULL) && (extsubset != NULL))
		*extsubset = 1;
	}
    }
    return(elemDecl);
}